

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_4_suite::test_linear_increase(void)

{
  undefined8 local_d8;
  value_type local_d0 [2];
  undefined8 local_c0;
  value_type local_b8 [2];
  undefined8 local_a8;
  value_type local_a0 [2];
  undefined8 local_90;
  value_type local_88 [2];
  undefined8 local_78;
  value_type local_70 [2];
  undefined8 local_60;
  value_type local_58 [2];
  undefined1 local_48 [8];
  moment<double,_4> filter;
  
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,1.0);
  local_58[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_60 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xf6,"void mean_double_4_suite::test_linear_increase()",local_58,&local_60);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,2.0);
  local_70[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_78 = 0x3ff8000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xf8,"void mean_double_4_suite::test_linear_increase()",local_70,&local_78);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,3.0);
  local_88[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_90 = 0x4000000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","2.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xfa,"void mean_double_4_suite::test_linear_increase()",local_88,&local_90);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,4.0);
  local_a0[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_a8 = 0x4004000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","2.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xfc,"void mean_double_4_suite::test_linear_increase()",local_a0,&local_a8);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,5.0);
  local_b8[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_c0 = 0x400c000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","3.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xfe,"void mean_double_4_suite::test_linear_increase()",local_b8,&local_c0);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48,6.0);
  local_d0[0] = trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_48);
  local_d8 = 0x4012000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","4.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x100,"void mean_double_4_suite::test_linear_increase()",local_d0,&local_d8);
  return;
}

Assistant:

void test_linear_increase()
{
    window::moment<double, 4> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(2.0);
    TRIAL_TEST_EQ(filter.mean(), 1.5);
    filter.push(3.0);
    TRIAL_TEST_EQ(filter.mean(), 2.0);
    filter.push(4.0);
    TRIAL_TEST_EQ(filter.mean(), 2.5);
    filter.push(5.0);
    TRIAL_TEST_EQ(filter.mean(), 3.5);
    filter.push(6.0);
    TRIAL_TEST_EQ(filter.mean(), 4.5);
}